

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_clear(nk_context *ctx)

{
  byte *pbVar1;
  nk_window *pnVar2;
  nk_page_element *pnVar3;
  nk_size in_RDX;
  nk_size extraout_RDX;
  nk_page_element *elem;
  nk_window *win;
  nk_page_element *pe;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x3a81,"void nk_clear(struct nk_context *)");
  }
  if (ctx->use_pool == 0) {
    nk_buffer_reset(&ctx->memory,NK_BUFFER_FRONT);
    in_RDX = extraout_RDX;
  }
  else {
    (ctx->memory).allocated = 0;
    (ctx->memory).needed = 0;
    (ctx->memory).size = (ctx->memory).memory.size;
  }
  ctx->build = 0;
  (ctx->memory).calls = 0;
  ctx->last_widget_state = 0;
  (ctx->style).cursor_active = (ctx->style).cursors[0];
  nk_memset(&ctx->overlay,0x40,in_RDX);
  win = ctx->begin;
  do {
    while( true ) {
      if (win == (nk_window *)0x0) {
        ctx->seq = ctx->seq + 1;
        return;
      }
      if (((win->flags & 0xc000) != 0x8000) || (win->seq != ctx->seq)) break;
LAB_00128440:
      win = win->next;
    }
    if (((win->flags & 0x6000) != 0) && (win == ctx->active)) {
      pnVar2 = win->prev;
      ctx->active = pnVar2;
      ctx->end = pnVar2;
      if (pnVar2 == (nk_window *)0x0) {
        ctx->begin = (nk_window *)0x0;
      }
      else {
        pbVar1 = (byte *)((long)&pnVar2->flags + 1);
        *pbVar1 = *pbVar1 & 0xef;
      }
    }
    pnVar2 = (win->popup).win;
    if ((pnVar2 != (nk_window *)0x0) && (pnVar2->seq != ctx->seq)) {
      nk_free_window(ctx,pnVar2);
      (win->popup).win = (nk_window *)0x0;
    }
    pnVar3 = (nk_page_element *)win->tables;
    while (elem = pnVar3, elem != (nk_page_element *)0x0) {
      pnVar3 = (nk_page_element *)(elem->data).tbl.next;
      if ((elem->data).tbl.seq != ctx->seq) {
        nk_remove_table(win,(nk_table *)elem);
        nk_zero(elem,0x1f0);
        nk_free_page_element(ctx,elem);
        if (elem == (nk_page_element *)win->tables) {
          win->tables = (nk_table *)pnVar3;
        }
      }
    }
    if ((win->seq == ctx->seq) && ((win->flags & 0x4000) == 0)) goto LAB_00128440;
    pnVar2 = win->next;
    nk_remove_window(ctx,win);
    nk_free_window(ctx,win);
    win = pnVar2;
  } while( true );
}

Assistant:

NK_API void
nk_clear(struct nk_context *ctx)
{
    struct nk_window *iter;
    struct nk_window *next;
    NK_ASSERT(ctx);

    if (!ctx) return;
    if (ctx->use_pool)
        nk_buffer_clear(&ctx->memory);
    else nk_buffer_reset(&ctx->memory, NK_BUFFER_FRONT);

    ctx->build = 0;
    ctx->memory.calls = 0;
    ctx->last_widget_state = 0;
    ctx->style.cursor_active = ctx->style.cursors[NK_CURSOR_ARROW];
    NK_MEMSET(&ctx->overlay, 0, sizeof(ctx->overlay));

    /* garbage collector */
    iter = ctx->begin;
    while (iter) {
        /* make sure valid minimized windows do not get removed */
        if ((iter->flags & NK_WINDOW_MINIMIZED) &&
            !(iter->flags & NK_WINDOW_CLOSED) &&
            iter->seq == ctx->seq) {
            iter = iter->next;
            continue;
        }
        /* remove hotness from hidden or closed windows*/
        if (((iter->flags & NK_WINDOW_HIDDEN) ||
            (iter->flags & NK_WINDOW_CLOSED)) &&
            iter == ctx->active) {
            ctx->active = iter->prev;
            ctx->end = iter->prev;
            if (!ctx->end)
                ctx->begin = 0;
            if (ctx->active)
                ctx->active->flags &= ~(unsigned)NK_WINDOW_ROM;
        }
        /* free unused popup windows */
        if (iter->popup.win && iter->popup.win->seq != ctx->seq) {
            nk_free_window(ctx, iter->popup.win);
            iter->popup.win = 0;
        }
        /* remove unused window state tables */
        {struct nk_table *n, *it = iter->tables;
        while (it) {
            n = it->next;
            if (it->seq != ctx->seq) {
                nk_remove_table(iter, it);
                nk_zero(it, sizeof(union nk_page_data));
                nk_free_table(ctx, it);
                if (it == iter->tables)
                    iter->tables = n;
            } it = n;
        }}
        /* window itself is not used anymore so free */
        if (iter->seq != ctx->seq || iter->flags & NK_WINDOW_CLOSED) {
            next = iter->next;
            nk_remove_window(ctx, iter);
            nk_free_window(ctx, iter);
            iter = next;
        } else iter = iter->next;
    }
    ctx->seq++;
}